

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

void __thiscall
t_d_generator::print_function_signature(t_d_generator *this,ostream *out,t_function *fn)

{
  t_struct *ptVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pptVar4;
  string local_70;
  string local_50;
  
  render_type_name_abi_cxx11_(&local_50,this,fn->returntype_,false);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  suffix_if_reserved(&local_70,&fn->name_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ptVar1 = fn->arglist_;
  pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      }
      render_type_name_abi_cxx11_(&local_50,this,(*pptVar4)->type_,true);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      suffix_if_reserved(&local_70,&(*pptVar4)->name_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pptVar4 = pptVar4 + 1;
      bVar2 = false;
    } while (pptVar4 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void print_function_signature(ostream& out, t_function* fn) {
    out << render_type_name(fn->get_returntype()) << " " << suffix_if_reserved(fn->get_name()) << "(";

    const vector<t_field*>& fields = fn->get_arglist()->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        out << ", ";
      }
      out << render_type_name((*f_iter)->get_type(), true) << " " << suffix_if_reserved((*f_iter)->get_name());
    }

    out << ")";
  }